

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* boost::xpressive::detail::
  make_independent_end_xpression<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            (bool pure)

{
  byte in_SIL;
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  true_matcher *in_stack_00000008;
  
  if ((in_SIL & 1) == 0) {
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::independent_end_matcher>
              ((independent_end_matcher *)in_stack_00000008);
  }
  else {
    make_dynamic<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::true_matcher>
              (in_stack_00000008);
  }
  return in_RDI;
}

Assistant:

inline sequence<BidiIter> make_independent_end_xpression(bool pure)
{
    if(pure)
    {
        return detail::make_dynamic<BidiIter>(detail::true_matcher());
    }
    else
    {
        return detail::make_dynamic<BidiIter>(detail::independent_end_matcher());
    }
}